

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqliteBuiltin_db_fetch_by_id(jx9_context *pCtx,int argc,jx9_value **argv)

{
  int iVar1;
  unqlite_col *pCol;
  jx9_value *pjVar2;
  char *pcVar3;
  int iFlag;
  SyString *pFuncName;
  jx9_vm *pVm;
  jx9_value *pDest;
  int nByte;
  SyString sName;
  uint local_34;
  SyString local_30;
  
  if (argc < 2) {
    pVm = pCtx->pVm;
    pFuncName = &pCtx->pFunc->sName;
    pcVar3 = "Missing collection name and/or record ID";
LAB_00117b68:
    jx9VmThrowError(pVm,pFuncName,1,pcVar3);
  }
  else {
    pcVar3 = jx9_value_to_string(*argv,(int *)&local_34);
    if ((int)local_34 < 1) {
      pVm = pCtx->pVm;
      pFuncName = &pCtx->pFunc->sName;
      pcVar3 = "Invalid collection name";
      goto LAB_00117b68;
    }
    pjVar2 = argv[1];
    jx9MemObjToInteger(pjVar2);
    iVar1 = *(int *)&pjVar2->x;
    local_30.nByte = local_34;
    local_30.zString = pcVar3;
    pCol = unqliteCollectionFetch((unqlite_vm *)pCtx->pFunc->pUserData,&local_30,iFlag);
    if (pCol != (unqlite_col *)0x0) {
      pjVar2 = jx9_context_new_scalar(pCtx);
      if (pjVar2 != (jx9_value *)0x0) {
        iVar1 = unqliteCollectionFetchRecordById(pCol,(long)iVar1,pjVar2);
        pDest = pCtx->pRet;
        if (iVar1 == 0) {
          jx9MemObjStore(pjVar2,pDest);
          return 0;
        }
        goto LAB_00117b76;
      }
      pVm = pCtx->pVm;
      pFuncName = &pCtx->pFunc->sName;
      pcVar3 = "Jx9 is running out of memory";
      goto LAB_00117b68;
    }
  }
  pDest = pCtx->pRet;
LAB_00117b76:
  jx9MemObjRelease(pDest);
  return 0;
}

Assistant:

static int unqliteBuiltin_db_fetch_by_id(jx9_context *pCtx,int argc,jx9_value **argv)
{
	unqlite_col *pCol;
	const char *zName;
	unqlite_vm *pVm;
	SyString sName;
	jx9_int64 nId;
	int nByte;
	int rc;
	/* Extract collection name */
	if( argc < 2 ){
		/* Missing arguments */
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Missing collection name and/or record ID");
		/* Return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	zName = jx9_value_to_string(argv[0],&nByte);
	if( nByte < 1){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection name");
		/* Return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the record ID */
	nId = jx9_value_to_int(argv[1]);
	SyStringInitFromBuf(&sName,zName,nByte);
	pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
	/* Fetch the collection */
	pCol = unqliteCollectionFetch(pVm,&sName,UNQLITE_VM_AUTO_LOAD);
	if( pCol ){
		/* Fetch the desired record */
		jx9_value *pValue;
		pValue = jx9_context_new_scalar(pCtx);
		if( pValue == 0 ){
			jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Jx9 is running out of memory");
			jx9_result_null(pCtx);
			return JX9_OK;
		}else{
			rc = unqliteCollectionFetchRecordById(pCol,nId,pValue);
			if( rc == UNQLITE_OK ){
				jx9_result_value(pCtx,pValue);
				/* pValue will be automatically released as soon we return from this function */
			}else{
				/* No such record, return null */
				jx9_result_null(pCtx);
			}
		}
	}else{
		/* No such collection, return null */
		jx9_result_null(pCtx);
	}
	return JX9_OK;
}